

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.c
# Opt level: O0

void apx_connectionManager_attach(apx_connectionManager_t *self,apx_serverConnection_t *connection)

{
  uint32_t connection_id_00;
  uint32_t connection_id;
  apx_serverConnection_t *connection_local;
  apx_connectionManager_t *self_local;
  
  if ((self != (apx_connectionManager_t *)0x0) && (connection != (apx_serverConnection_t *)0x0)) {
    pthread_spin_lock(&self->lock);
    connection_id_00 = apx_connectionManager_generate_connection_id(self);
    adt_list_insert_unique(&self->active_connections,connection);
    pthread_spin_unlock(&self->lock);
    apx_serverConnection_set_connection_id(connection,connection_id_00);
    apx_serverConnection_connected_notification(connection);
  }
  return;
}

Assistant:

void apx_connectionManager_attach(apx_connectionManager_t *self, apx_serverConnection_t *connection)
{
   if ( (self != 0) && (connection != 0) )
   {
      uint32_t connection_id;
      SPINLOCK_ENTER(self->lock);
      connection_id = apx_connectionManager_generate_connection_id(self);
      adt_list_insert_unique(&self->active_connections, connection);
      SPINLOCK_LEAVE(self->lock);
      apx_serverConnection_set_connection_id(connection, connection_id);
      apx_serverConnection_connected_notification(connection);
#if (APX_DEBUG_ENABLE)
      printf("[CONNECTION-MANAGER] New connection %d\n", (int)connection_id);
#endif
   }
}